

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QSet<QWidget_*> __thiscall QDockAreaLayout::usedSeparatorWidgets(QDockAreaLayout *this)

{
  ulong uVar1;
  long in_RSI;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QHashDummyValue local_41;
  QWidget *local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  this->corners[0] = NoDockWidgetArea;
  this->corners[1] = NoDockWidgetArea;
  uVar3 = (uint)*(undefined8 *)(in_RSI + 0x218);
  QHash<QWidget_*,_QHashDummyValue>::reserve
            ((QHash<QWidget_*,_QHashDummyValue> *)this,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    uVar1 = 0;
    do {
      local_40 = *(QWidget **)(*(long *)(in_RSI + 0x210) + uVar1 * 8);
      QHash<QWidget*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QWidget*,QHashDummyValue> *)this,&stack0xffffffffffffffc0,&local_41);
      uVar1 = uVar1 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar1);
  }
  lVar2 = 0x40;
  do {
    QDockAreaLayoutInfo::usedSeparatorWidgets((QDockAreaLayoutInfo *)&stack0xffffffffffffffc0);
    QSet<QWidget_*>::unite((QSet<QWidget_*> *)this,(QSet<QWidget_*> *)&stack0xffffffffffffffc0);
    QHash<QWidget_*,_QHashDummyValue>::~QHash
              ((QHash<QWidget_*,_QHashDummyValue> *)&stack0xffffffffffffffc0);
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x200);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSet<QWidget_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QWidget*> QDockAreaLayout::usedSeparatorWidgets() const
{
    QSet<QWidget*> result;
    const int numSeparators = separatorWidgets.size();
    result.reserve(numSeparators);
    for (int i = 0; i < numSeparators; ++i)
        result << separatorWidgets.at(i);
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        result += dock.usedSeparatorWidgets();
    }
    return result;
}